

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.cc
# Opt level: O0

void __thiscall draco::PointCloudDecoder::PointCloudDecoder(PointCloudDecoder *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__PointCloudDecoder_002731e0;
  in_RDI[1] = 0;
  std::
  vector<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
  ::vector((vector<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
            *)0x182f32);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x182f40);
  in_RDI[8] = 0;
  *(undefined1 *)(in_RDI + 9) = 0;
  *(undefined1 *)((long)in_RDI + 0x49) = 0;
  in_RDI[10] = 0;
  return;
}

Assistant:

PointCloudDecoder::PointCloudDecoder()
    : point_cloud_(nullptr),
      buffer_(nullptr),
      version_major_(0),
      version_minor_(0),
      options_(nullptr) {}